

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint32_t bcm2835_peri_read(uint32_t *paddr)

{
  uint32_t ret;
  uint32_t *paddr_local;
  
  if (debug == '\0') {
    paddr_local._4_4_ = *paddr;
  }
  else {
    printf("bcm2835_peri_read  paddr %p\n",paddr);
    paddr_local._4_4_ = 0;
  }
  return paddr_local._4_4_;
}

Assistant:

uint32_t bcm2835_peri_read(volatile uint32_t* paddr)
{
    uint32_t ret;
    if (debug)
    {
		printf("bcm2835_peri_read  paddr %p\n", (void *) paddr);
		return 0;
    }
    else
    {
       __sync_synchronize();
       ret = *paddr;
       __sync_synchronize();
       return ret;
    }
}